

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# align_code.cpp
# Opt level: O2

void __thiscall
backend::codegen::CodeAlignOptimization::optimize_func
          (CodeAlignOptimization *this,Function *f,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  pointer puVar1;
  __uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_> _Var2;
  pointer puVar3;
  int iVar4;
  mapped_type *__any;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *__x;
  long lVar5;
  iterator iVar6;
  ulong uVar7;
  long lVar8;
  size_t index;
  ulong uVar9;
  long *plVar10;
  _Head_base<0UL,_arm::Inst_*,_false> local_e0;
  _Head_base<0UL,_arm::CtrlInst_*,_false> local_d8;
  bool local_cc [4];
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *local_c8;
  undefined **local_c0;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  inst_new;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_str;
  mapped_type cycle_set;
  
  __any = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::at(extra_data_repo,(key_type *)::optimization::CYCLE_START_DATA_NAME_abi_cxx11_);
  std::
  any_cast<std::unordered_map<std::__cxx11::string,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>>
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)&id_str,__any);
  __x = &std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&id_str,&f->name)->_M_t;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&cycle_set._M_t,__x);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&id_str);
  inst_new.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inst_new.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inst_new.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = &f->inst;
  lVar8 = 0;
  local_c0 = &PTR_display_001db748;
  uVar9 = 0;
  do {
    puVar1 = (f->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(f->inst).
                      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar9) {
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::_M_move_assign(local_c8,&inst_new);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::~vector(&inst_new);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&cycle_set._M_t);
      return;
    }
    _Var2._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         puVar1[uVar9]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t;
    if (((_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)
         _Var2._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl != (Inst *)0x0) &&
       (*(undefined ***)
         _Var2._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl == local_c0)) {
      plVar10 = (long *)((long)_Var2._M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10);
      lVar5 = std::__cxx11::string::find((char *)plVar10,0x193655);
      if (lVar5 == 0) {
        puVar3 = (f->inst).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (uVar7 = 1; uVar7 != 7; uVar7 = uVar7 + 1) {
          if (((ulong)((long)(f->inst).
                             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <=
               uVar7 + uVar9) ||
             (*(int *)(*(long *)((long)&puVar3[uVar7]._M_t.
                                        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                        .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                lVar8) + 8) - 1U < 5)) {
            if (uVar7 < 5) goto LAB_0015db83;
            break;
          }
        }
        std::__cxx11::string::find_last_of((char *)plVar10,0x193fb4);
        std::__cxx11::string::substr((ulong)&id_str,(ulong)plVar10);
        iVar4 = std::__cxx11::stoi(&id_str,(size_t *)0x0,10);
        local_e0._M_head_impl._0_4_ = iVar4;
        iVar6 = std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::find(&cycle_set._M_t,(key_type_conflict *)&local_e0);
        if ((_Rb_tree_header *)iVar6._M_node != &cycle_set._M_t._M_impl.super__Rb_tree_header) {
          local_cc[0] = true;
          local_cc[1] = false;
          local_cc[2] = false;
          local_cc[3] = false;
          std::make_unique<arm::CtrlInst,char_const(&)[6],int,bool>
                    ((char (*) [6])&local_d8,(int *)"align",local_cc);
          local_e0._M_head_impl = &(local_d8._M_head_impl)->super_Inst;
          local_d8._M_head_impl = (CtrlInst *)0x0;
          std::
          vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
          ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                    ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                      *)&inst_new,
                     (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_e0);
          if (local_e0._M_head_impl != (Inst *)0x0) {
            (*((local_e0._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
          }
          local_e0._M_head_impl = (Inst *)0x0;
          std::unique_ptr<arm::CtrlInst,_std::default_delete<arm::CtrlInst>_>::~unique_ptr
                    ((unique_ptr<arm::CtrlInst,_std::default_delete<arm::CtrlInst>_> *)&local_d8);
        }
        std::__cxx11::string::~string((string *)&id_str);
      }
    }
LAB_0015db83:
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&inst_new,puVar1 + uVar9);
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 8;
  } while( true );
}

Assistant:

void CodeAlignOptimization::optimize_func(
    arm::Function &f, std::map<std::string, std::any> &extra_data_repo) {
  auto cycle_set = std::any_cast<optimization::CycleStartType>(
                       extra_data_repo.at(optimization::CYCLE_START_DATA_NAME))
                       .at(f.name);
  std::vector<std::unique_ptr<arm::Inst>> inst_new;
  for (size_t index = 0; index < f.inst.size(); index++) {
    auto i = f.inst.begin() + index;
    if (auto x = dynamic_cast<arm::LabelInst *>(i->get())) {
      if (x->label.find(".bb_") == 0) {
        uint32_t cmpuInstNum;
        uint32_t totalInstNum;

        cmpuInstNum = 0;
        for (totalInstNum = 1;
             totalInstNum <= 6 && index + totalInstNum < f.inst.size();
             totalInstNum++) {
          arm::Inst *inst = (f.inst.begin() + index + totalInstNum)->get();
          if (inst->op == arm::OpCode::LdR || inst->op == arm::OpCode::LdM ||
              inst->op == arm::OpCode::StR || inst->op == arm::OpCode::StM ||
              inst->op == arm::OpCode::Push || inst->op == arm::OpCode::Pop) {
          } else if (inst->op == arm::OpCode::B ||
                     inst->op == arm::OpCode::Bl ||
                     inst->op == arm::OpCode::Bx ||
                     inst->op == arm::OpCode::Cbz ||
                     inst->op == arm::OpCode::Cbnz) {
            break;
          } else {
            cmpuInstNum++;
          }
        }

        if (totalInstNum >= 5) {
          try {
            auto bb_id_idx = x->label.find_last_of("$");
            auto id_str = x->label.substr(bb_id_idx + 1);
            auto bb_id = std::stoi(id_str);
            if (cycle_set.find(bb_id) != cycle_set.end()) {
              inst_new.push_back(std::make_unique<CtrlInst>("align", 7, true));
            }
          } catch (std::exception &i) {
          }
        }
      }
    }
    inst_new.push_back(std::move(*i));
  }
  f.inst = std::move(inst_new);
}